

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_yv12_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,int num_planes)

{
  undefined8 unaff_RBX;
  int in_ESI;
  uint8_t *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int plane_border_1;
  int is_uv_1;
  int plane_1;
  int plane_border;
  int is_uv;
  int plane;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar1;
  
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      extend_plane((uint8_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),iVar1,
                   (uint)(0 < iVar1),*(int *)(in_RDI + 0x80) >> (0 < iVar1),
                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(int)in_RDI,(int)unaff_RBX,
                   unaff_retaddr,in_stack_00000008);
    }
  }
  else {
    for (iVar1 = 0; iVar1 < in_ESI; iVar1 = iVar1 + 1) {
      extend_plane_high(in_RDI,in_ESI,iVar1,(uint)(0 < iVar1),*(int *)(in_RDI + 0x80) >> (0 < iVar1)
                        ,in_stack_ffffffffffffffdc,unaff_retaddr,in_stack_00000008,in_stack_00000010
                        ,in_stack_00000018);
    }
  }
  return;
}

Assistant:

void aom_yv12_extend_frame_borders_c(YV12_BUFFER_CONFIG *ybf,
                                     const int num_planes) {
  assert(ybf->border % 2 == 0);
  assert(ybf->y_height - ybf->y_crop_height < 16);
  assert(ybf->y_width - ybf->y_crop_width < 16);
  assert(ybf->y_height - ybf->y_crop_height >= 0);
  assert(ybf->y_width - ybf->y_crop_width >= 0);

#if CONFIG_AV1_HIGHBITDEPTH
  if (ybf->flags & YV12_FLAG_HIGHBITDEPTH) {
    for (int plane = 0; plane < num_planes; ++plane) {
      const int is_uv = plane > 0;
      const int plane_border = ybf->border >> is_uv;
      extend_plane_high(
          ybf->buffers[plane], ybf->strides[is_uv], ybf->crop_widths[is_uv],
          ybf->crop_heights[is_uv], plane_border, plane_border,
          plane_border + ybf->heights[is_uv] - ybf->crop_heights[is_uv],
          plane_border + ybf->widths[is_uv] - ybf->crop_widths[is_uv], 0,
          ybf->crop_heights[is_uv]);
    }
    return;
  }
#endif

  for (int plane = 0; plane < num_planes; ++plane) {
    const int is_uv = plane > 0;
    const int plane_border = ybf->border >> is_uv;
    extend_plane(ybf->buffers[plane], ybf->strides[is_uv],
                 ybf->crop_widths[is_uv], ybf->crop_heights[is_uv],
                 plane_border, plane_border,
                 plane_border + ybf->heights[is_uv] - ybf->crop_heights[is_uv],
                 plane_border + ybf->widths[is_uv] - ybf->crop_widths[is_uv], 0,
                 ybf->crop_heights[is_uv]);
  }
}